

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O1

bool __thiscall create::Create::driveRadius(Create *this,float *vel,float *radius)

{
  uint uVar1;
  int iVar2;
  ssize_t sVar3;
  size_t __n;
  short sVar4;
  int in_R8D;
  float fVar5;
  float fVar6;
  float fVar7;
  uint8_t cmd [5];
  undefined1 local_25;
  undefined1 local_24;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  
  fVar6 = *vel;
  fVar5 = RobotModel::getMaxVelocity(&this->model);
  if (-fVar5 <= fVar6) {
    fVar6 = *vel;
    fVar5 = RobotModel::getMaxVelocity(&this->model);
    if (fVar6 <= fVar5) {
      fVar6 = *vel;
    }
    else {
      fVar6 = RobotModel::getMaxVelocity(&this->model);
    }
  }
  else {
    fVar6 = RobotModel::getMaxVelocity(&this->model);
    fVar6 = -fVar6;
  }
  fVar5 = roundf(*radius * 1000.0);
  sVar4 = (short)(int)fVar5;
  uVar1 = (int)fVar5 & 0xffff;
  __n = (size_t)(uVar1 - 0x7fff);
  if (((1 < uVar1 - 0x7fff) && (uVar1 != 1)) && (uVar1 != 0xffff)) {
    iVar2 = (int)sVar4;
    sVar4 = -2000;
    if (-0x7d1 < iVar2) {
      fVar7 = (float)iVar2;
      fVar5 = 2000.0;
      if (fVar7 <= 2000.0) {
        fVar5 = fVar7;
      }
      sVar4 = (short)(int)fVar5;
    }
  }
  fVar6 = roundf(fVar6 * 1000.0);
  local_25 = 0x89;
  local_24 = (undefined1)((uint)(int)fVar6 >> 8);
  local_23 = (undefined1)(int)fVar6;
  local_22 = (undefined1)((ushort)sVar4 >> 8);
  local_21 = (undefined1)sVar4;
  sVar3 = Serial::send((this->serial).super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(int)&local_25,(void *)0x5,__n,in_R8D);
  return SUB81(sVar3,0);
}

Assistant:

bool Create::driveRadius(const float& vel, const float& radius) {
    // Bound velocity
    float boundedVel = BOUND_CONST(vel, -model.getMaxVelocity(), model.getMaxVelocity());

    // Expects each parameter as two bytes each and in millimeters
    int16_t vel_mm = roundf(boundedVel * 1000);
    int16_t radius_mm = roundf(radius * 1000);

    // Bound radius if not a special case
    if (radius_mm != -32768 && radius_mm != 32767 &&
        radius_mm != -1 && radius_mm != 1) {
      BOUND(radius_mm, -util::MAX_RADIUS * 1000, util::MAX_RADIUS * 1000);
    }

    uint8_t cmd[5] = { OC_DRIVE,
                       static_cast<uint8_t>(vel_mm >> 8),
                       static_cast<uint8_t>(vel_mm & 0xff),
                       static_cast<uint8_t>(radius_mm >> 8),
                       static_cast<uint8_t>(radius_mm & 0xff)
                     };

    return serial->send(cmd, 5);
  }